

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O2

void setter_thread_body(void *arg)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar2 = 0x32;
  do {
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar4) {
      return;
    }
    iVar1 = uv_set_process_title
                      ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled")
    ;
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar3 = "uv_set_process_title(titles[0])";
      uVar5 = 0x49;
      goto LAB_00166171;
    }
    iVar1 = uv_set_process_title
                      ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82")
    ;
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar3 = "uv_set_process_title(titles[1])";
      uVar5 = 0x4a;
      goto LAB_00166171;
    }
    iVar1 = uv_set_process_title
                      ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT")
    ;
    eval_a = (int64_t)iVar1;
    if (eval_a != 0) {
      pcVar3 = "uv_set_process_title(titles[2])";
      uVar5 = 0x4b;
      goto LAB_00166171;
    }
    iVar1 = uv_set_process_title
                      ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU")
    ;
    eval_a = (int64_t)iVar1;
  } while (eval_a == 0);
  pcVar3 = "uv_set_process_title(titles[3])";
  uVar5 = 0x4c;
LAB_00166171:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
          ,uVar5,pcVar3,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT_OK(uv_set_process_title(titles[0]));
    ASSERT_OK(uv_set_process_title(titles[1]));
    ASSERT_OK(uv_set_process_title(titles[2]));
    ASSERT_OK(uv_set_process_title(titles[3]));
  }
}